

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_fast_union_64(void **param_1)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint32_t i;
  uint32_t x;
  uint uVar4;
  long lVar5;
  Roaring64Map r1_map;
  Roaring64Map r0_map;
  Roaring64Map expected;
  Roaring64Map r2_map;
  Roaring64Map *maps [3];
  Roaring64Map actual;
  Roaring64Map local_188;
  Roaring64Map local_148;
  Roaring64Map local_108;
  Roaring64Map local_c8;
  Roaring64Map *local_88;
  undefined1 *local_80;
  Roaring64Map *local_78;
  Roaring64Map local_68;
  
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_148.roarings._M_t._M_impl._0_8_ = 0;
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        x = 0;
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_148.copyOnWrite = false;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_188.roarings._M_t._M_impl._0_8_ = 0;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_188.copyOnWrite = false;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8.roarings._M_t._M_impl._0_8_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c8.copyOnWrite = false;
        local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_188.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_148.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (((uint)lVar3 >> (x & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_148,x);
          }
          x = x + 1;
        } while (x != 0x20);
        uVar4 = 0;
        do {
          if (((uint)lVar2 >> (uVar4 & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_188,uVar4 + 0x1000);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
        uVar4 = 0;
        do {
          if (((uint)lVar5 >> (uVar4 & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_c8,uVar4 + 0x2000);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
        local_88 = &local_148;
        local_80 = (undefined1 *)&local_188;
        local_78 = &local_c8;
        roaring::Roaring64Map::fastunion(&local_68,3,&local_88);
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_108.roarings._M_t._M_impl._0_8_ = 0;
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_108.copyOnWrite = false;
        uVar4 = 0;
        local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (((uint)lVar3 >> (uVar4 & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_108,uVar4);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
        uVar4 = 0;
        do {
          if (((uint)lVar2 >> (uVar4 & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_108,uVar4 + 0x1000);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
        uVar4 = 0;
        do {
          if (((uint)lVar5 >> (uVar4 & 0x1f) & 1) != 0) {
            roaring::Roaring64Map::add(&local_108,uVar4 + 0x2000);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
        bVar1 = roaring::Roaring64Map::operator==(&local_108,&local_68);
        _assert_true((ulong)bVar1,"expected == actual",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                     ,0x7c6);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&local_108);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&local_68);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&local_c8);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&local_188);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&local_148);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_fast_union_64) {
    auto update = [](Roaring64Map *dest, uint32_t bitmask, uint32_t offset) {
        for (uint32_t i = 0; i != 32; ++i) {
            if ((bitmask & (1 << i)) != 0) {
                dest->add(offset + i);
            }
        }
    };

    // Generate three Roaring64Maps that have a variety of combinations of
    // present and absent slots and calculate their union with fastunion.
    const uint32_t num_slots_to_test = 4;
    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (size_t r0_bitmask = 0; r0_bitmask != bitmask_limit; ++r0_bitmask) {
        for (size_t r1_bitmask = 0; r1_bitmask != bitmask_limit; ++r1_bitmask) {
            for (size_t r2_bitmask = 0; r2_bitmask != bitmask_limit;
                 ++r2_bitmask) {
                Roaring64Map r0_map, r1_map, r2_map;
                update(&r0_map, r0_bitmask, 0);
                update(&r1_map, r1_bitmask, 0x1000);
                update(&r2_map, r2_bitmask, 0x2000);

                const Roaring64Map *maps[] = {&r0_map, &r1_map, &r2_map};
                auto actual = Roaring64Map::fastunion(3, maps);

                Roaring64Map expected;
                update(&expected, r0_bitmask, 0);
                update(&expected, r1_bitmask, 0x1000);
                update(&expected, r2_bitmask, 0x2000);

                assert_true(expected == actual);
            }
        }
    }
}